

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int spi_write(int pi,uint handle,char *buf,uint count)

{
  int iVar1;
  gpioExtent_t *in_RDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,0,
                             in_RDX,in_ESI);
  return iVar1;
}

Assistant:

int spi_write(int pi, unsigned handle, char *buf, unsigned count)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=0
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (pi, PI_CMD_SPIW, handle, 0, count, 1, ext, 1);
}